

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp.c
# Opt level: O2

void vorbis_lsp_to_curve(float *curve,int *map,int n,int ln,float *lsp,int m,float amp,
                        float ampoffset)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  double dVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar6 = 0;
  uVar7 = 0;
  if (0 < m) {
    uVar7 = (ulong)(uint)m;
  }
  for (; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    dVar9 = cos((double)lsp[uVar6]);
    lsp[uVar6] = (float)(dVar9 + dVar9);
  }
  for (iVar5 = 0; iVar5 < n; iVar5 = iVar5 + (int)lVar4) {
    iVar1 = map[iVar5];
    dVar9 = cos((double)((float)iVar1 * (3.1415927 / (float)ln)));
    fVar11 = (float)(dVar9 + dVar9);
    lVar3 = 1;
    fVar8 = 0.5;
    fVar10 = 0.5;
    while( true ) {
      if (m <= lVar3) break;
      fVar8 = fVar8 * (fVar11 - (float)*(undefined8 *)(lsp + lVar3 + -1));
      fVar10 = fVar10 * (fVar11 - (float)((ulong)*(undefined8 *)(lsp + lVar3 + -1) >> 0x20));
      lVar3 = lVar3 + 2;
    }
    if (m == (int)lVar3) {
      fVar8 = (fVar11 - lsp[(ulong)(uint)m - 1]) * fVar8;
      fVar12 = 4.0 - fVar11 * fVar11;
      fVar8 = fVar8 * fVar8;
    }
    else {
      fVar12 = 2.0 - fVar11;
      fVar8 = (fVar11 + 2.0) * fVar8 * fVar8;
    }
    dVar9 = (double)(fVar12 * fVar10 * fVar10 + fVar8);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar9 = exp(((double)amp / dVar9 - (double)ampoffset) * 0.1151292473077774);
    lVar3 = 0;
    do {
      curve[iVar5 + lVar3] = curve[iVar5 + lVar3] * (float)dVar9;
      lVar4 = lVar3 + 1;
      lVar2 = lVar3 + 1;
      lVar3 = lVar4;
    } while (map[iVar5 + lVar2] == iVar1);
  }
  return;
}

Assistant:

void vorbis_lsp_to_curve(float *curve,int *map,int n,int ln,float *lsp,int m,
                            float amp,float ampoffset){
  int i;
  float wdel=M_PI/ln;
  for(i=0;i<m;i++)lsp[i]=2.f*cos(lsp[i]);

  i=0;
  while(i<n){
    int j,k=map[i];
    float p=.5f;
    float q=.5f;
    float w=2.f*cos(wdel*k);
    for(j=1;j<m;j+=2){
      q *= w-lsp[j-1];
      p *= w-lsp[j];
    }
    if(j==m){
      /* odd order filter; slightly assymetric */
      /* the last coefficient */
      q*=w-lsp[j-1];
      p*=p*(4.f-w*w);
      q*=q;
    }else{
      /* even order filter; still symmetric */
      p*=p*(2.f-w);
      q*=q*(2.f+w);
    }

    q=fromdB(amp/sqrt(p+q)-ampoffset);

    curve[i]*=q;
    while(map[++i]==k)curve[i]*=q;
  }
}